

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O1

void absl::lts_20250127::cord_internal::CordRep::Unref(CordRep *rep)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  
  if (rep == (CordRep *)0x0) {
    __assert_fail("rep != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x397,"static void absl::cord_internal::CordRep::Unref(CordRep *)");
  }
  LOCK();
  pRVar1 = &rep->refcount;
  uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
  (pRVar1->count_).super___atomic_base<int>._M_i =
       (pRVar1->count_).super___atomic_base<int>._M_i + -2;
  UNLOCK();
  if ((uVar2 & 1) != 0 || 0 < (int)uVar2) {
    if (uVar2 != 2) {
      return;
    }
    Destroy(rep);
    return;
  }
  __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0xac,"bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
}

Assistant:

inline void CordRep::Unref(CordRep* rep) {
  assert(rep != nullptr);
  // Expect refcount to be 0. Avoiding the cost of an atomic decrement should
  // typically outweigh the cost of an extra branch checking for ref == 1.
  if (ABSL_PREDICT_FALSE(!rep->refcount.DecrementExpectHighRefcount())) {
    Destroy(rep);
  }
}